

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O1

void __thiscall mjs::gc_heap::gc_heap(gc_heap *this,uint32_t capacity)

{
  gc_heap_ptr_untyped **ppgVar1;
  slot *psVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ppgVar1 = pointer_set::alloc(10);
  (this->pointers_).set_ = ppgVar1;
  (this->pointers_).capacity_ = 10;
  (this->pointers_).size_ = 0;
  psVar2 = (slot *)malloc((ulong)capacity << 3);
  (this->alloc_context_).storage_ = psVar2;
  (this->alloc_context_).capacity_ = capacity >> 1;
  (this->alloc_context_).start_ = 0;
  (this->alloc_context_).next_free_ = 0;
  if (capacity < 2) {
    __assert_fail("start < capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x149,
                  "mjs::gc_heap::allocation_context::allocation_context(slot *, uint32_t, uint32_t)"
                 );
  }
  this->owns_storage_ = true;
  (this->gc_state_).level = 0;
  (this->gc_state_).new_context = (allocation_context *)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (psVar2 != (slot *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_68,capacity);
  std::operator+(&local_48,"Could not allocate heap for ",&local_68);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_88 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_88);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

gc_heap::gc_heap(uint32_t capacity) : alloc_context_(std::malloc(capacity * sizeof(slot)), capacity), owns_storage_(true) {
    if (!alloc_context_.storage()) {
        throw std::runtime_error("Could not allocate heap for " + std::to_string(capacity) + " slots");
    }
}